

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsFieldAttachMetaData(FmsField field,FmsMetaData *mdata)

{
  int iVar1;
  FmsMetaData mdata_00;
  
  if (field == (FmsField)0x0) {
    return 1;
  }
  if (mdata == (FmsMetaData *)0x0) {
    iVar1 = 2;
  }
  else {
    mdata_00 = field->mdata;
    if (mdata_00 == (FmsMetaData)0x0) {
      mdata_00 = (FmsMetaData)calloc(1,0x20);
      if (mdata_00 == (FmsMetaData)0x0) {
        return 3;
      }
      field->mdata = mdata_00;
    }
    else {
      iVar1 = FmsMetaDataClear(mdata_00);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    *mdata = mdata_00;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int FmsFieldAttachMetaData(FmsField field, FmsMetaData *mdata) {
  if (!field) { E_RETURN(1); }
  if (!mdata) { E_RETURN(2); }
  FmsMetaData md = field->mdata;
  if (md == NULL) {
    md = calloc(1, sizeof(*md));
    if (md == NULL) { E_RETURN(3); }
    field->mdata = md;
  } else {
    int err = FmsMetaDataClear(md);
    if (err) { E_RETURN(err); }
  }
  *mdata = md;
  return 0;
}